

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

_Bool prefix_i(char *s,char *t)

{
  int iVar1;
  int iVar2;
  byte *local_20;
  char *t_local;
  char *s_local;
  
  local_20 = (byte *)t;
  t_local = s;
  while( true ) {
    if (*local_20 == 0) {
      return true;
    }
    iVar1 = toupper((uint)*local_20);
    iVar2 = toupper((uint)(byte)*t_local);
    if (iVar1 != iVar2) break;
    local_20 = local_20 + 1;
    t_local = t_local + 1;
  }
  return false;
}

Assistant:

bool prefix_i(const char *s, const char *t)
{
	/* Scan "t" */
	while (*t)
	{
		if (toupper((unsigned char)*t) != toupper((unsigned char)*s))
			return (false);
		else
		{
			t++;
			s++;
		}
	}

	/* Matched, we have a prefix */
	return (true);
}